

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_2::MaxSamplesCase::preDraw(MaxSamplesCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  deInt32 maxSamples;
  allocator<char> local_1a1;
  MessageBuilder local_1a0;
  long lVar4;
  
  iVar2 = (*((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x868))(0x8d57);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"query GL_MAX_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                  ,0x173);
  local_1a0.m_log =
       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
        super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"GL_MAX_SAMPLES = ");
  std::ostream::operator<<(poVar1,-1);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  iVar2 = (**(code **)(lVar4 + 0xb48))
                    ((((this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_program)->
                     m_program).m_program,"u_maxSamples");
  if (iVar2 != -1) {
    (**(code **)(lVar4 + 0x14f0))(iVar2,0xffffffff);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"set u_maxSamples uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSampleVariableTests.cpp"
                    ,0x17f);
    local_1a0.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Set u_maxSamples = ");
    std::ostream::operator<<(poVar1,-1);
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"Location of u_maxSamples was -1",&local_1a1);
  tcu::TestError::TestError(this_00,(string *)&local_1a0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void MaxSamplesCase::preDraw (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	deInt32					maxSamples	= -1;

	// query samples
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query GL_MAX_SAMPLES");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;
	}

	// set samples
	{
		const int maxSampleLoc = gl.getUniformLocation(m_program->getProgram(), "u_maxSamples");
		if (maxSampleLoc == -1)
			throw tcu::TestError("Location of u_maxSamples was -1");

		gl.uniform1i(maxSampleLoc, maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set u_maxSamples uniform");

		m_testCtx.getLog() << tcu::TestLog::Message << "Set u_maxSamples = " << maxSamples << tcu::TestLog::EndMessage;
	}
}